

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGLDriver::addHighLevelShaderMaterial(COpenGLDriver *this)

{
  c8 *unaff_RBP;
  c8 *unaff_R12;
  c8 *unaff_R13;
  undefined8 unaff_R14;
  c8 *unaff_R15;
  COpenGLDriver *unaff_retaddr;
  E_PIXEL_SHADER_TYPE in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined4 in_stack_0000004c;
  undefined4 in_stack_00000050;
  undefined4 in_stack_00000054;
  E_GEOMETRY_SHADER_TYPE in_stack_00000058;
  E_PRIMITIVE_TYPE in_stack_00000060;
  E_PRIMITIVE_TYPE in_stack_00000068;
  u32 in_stack_00000070;
  IShaderConstantSetCallBack *in_stack_00000078;
  E_MATERIAL_TYPE in_stack_00000080;
  s32 in_stack_00000088;
  
  addHighLevelShaderMaterial
            (unaff_retaddr,unaff_RBP,unaff_R15,(E_VERTEX_SHADER_TYPE)((ulong)unaff_R14 >> 0x20),
             unaff_R13,unaff_R12,in_stack_00000040,
             (c8 *)CONCAT44(in_stack_0000004c,in_stack_00000048),
             (c8 *)CONCAT44(in_stack_00000054,in_stack_00000050),in_stack_00000058,in_stack_00000060
             ,in_stack_00000068,in_stack_00000070,in_stack_00000078,in_stack_00000080,
             in_stack_00000088);
  return;
}

Assistant:

s32 COpenGLDriver::addHighLevelShaderMaterial(
		const c8 *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const c8 *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const c8 *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType,
		scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	s32 nr = -1;

	COpenGLSLMaterialRenderer *r = new COpenGLSLMaterialRenderer(
			this, nr,
			vertexShaderProgram, vertexShaderEntryPointName, vsCompileTarget,
			pixelShaderProgram, pixelShaderEntryPointName, psCompileTarget,
			geometryShaderProgram, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	r->drop();

	return nr;
}